

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTricycle.cpp
# Opt level: O0

int __thiscall CTestTricycle::Run(CTestTricycle *this,int nTestCase)

{
  float fVar1;
  float fVar2;
  SPose pose_00;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  CTricycle *this_00;
  CVirtualGyro *pCVar6;
  pointer p_Var7;
  float angular_velocity;
  SPose SVar8;
  _tagSRecord *local_78;
  float local_70;
  __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
  local_58;
  __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
  local_50;
  iterator it;
  _tagSRecord *local_28;
  SPose pose;
  int nTestCase_local;
  CTestTricycle *this_local;
  
  pose.y = (float)nTestCase;
  unique0x1000032c = this;
  _tagSPose::_tagSPose((_tagSPose *)&local_28);
  SetFilename(this,(int)pose.y);
  iVar4 = ReadInputFile(this);
  if (iVar4 == 0) {
    CreateResultFiles(this);
    this_00 = TSingleton<CTricycle>::GetInstance();
    CTricycle::GetRobotPose(this_00,(SPose *)&local_28);
    it._M_current = local_28;
    SVar8.q = pose.x;
    SVar8._0_8_ = local_28;
    Write(this,0.0,SVar8);
    local_50._M_current =
         (_tagSRecord *)
         std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>::begin
                   (&this->m_vRecord);
    while( true ) {
      local_58._M_current =
           (_tagSRecord *)
           std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>::end
                     (&this->m_vRecord);
      bVar3 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar3) break;
      pCVar6 = TSingleton<CVirtualGyro>::GetInstance();
      p_Var7 = __gnu_cxx::
               __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
               ::operator->(&local_50);
      fVar1 = p_Var7->time;
      p_Var7 = __gnu_cxx::
               __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
               ::operator->(&local_50);
      fVar2 = p_Var7->steering_angle;
      p_Var7 = __gnu_cxx::
               __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
               ::operator->(&local_50);
      CVirtualGyro::Update(pCVar6,fVar1,fVar2,p_Var7->encoder_ticks);
      p_Var7 = __gnu_cxx::
               __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
               ::operator->(&local_50);
      fVar1 = p_Var7->time;
      p_Var7 = __gnu_cxx::
               __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
               ::operator->(&local_50);
      fVar2 = p_Var7->steering_angle;
      p_Var7 = __gnu_cxx::
               __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
               ::operator->(&local_50);
      iVar4 = p_Var7->encoder_ticks;
      pCVar6 = TSingleton<CVirtualGyro>::GetInstance();
      angular_velocity = CVirtualGyro::GetAngVel(pCVar6);
      SVar8 = estimate(fVar1,fVar2,iVar4,angular_velocity);
      local_70 = SVar8.q;
      local_78 = SVar8._0_8_;
      pose.x = local_70;
      local_28 = local_78;
      p_Var7 = __gnu_cxx::
               __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
               ::operator->(&local_50);
      pose_00.q = pose.x;
      pose_00._0_8_ = local_28;
      Write(this,p_Var7->time,pose_00);
      __gnu_cxx::
      __normal_iterator<CTestTricycle::_tagSRecord_*,_std::vector<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>_>
      ::operator++(&local_50);
    }
    CloseResultFiles(this);
    DrawGnuplot(this,false,0.0,0.0,0.0,0.0);
    poVar5 = std::operator<<((ostream *)&std::cout,"Press any key in this window to quit.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    getch();
    this_local._4_4_ = 0;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Error occurred in ReadInputFile().");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int CTestTricycle::Run(const int nTestCase)
{
	/// robot pose (x, y, heading)
	SPose pose;

	/// set filenames for input, pose, and contour
	SetFilename(nTestCase);

	/// read the input file
	if (ReadInputFile() != 0)
	{
		std::cout << "Error occurred in ReadInputFile()." << std::endl;
		return -1;
	}

	/// create result files (pose, contour)
	CreateResultFiles();

	/// write initial pose to output files
	//@{
	CTricycle::GetInstance()->GetRobotPose(pose);
	Write(0.f, pose);
	//@}

	/// calculate odometry for each record
	//@{
	for (std::vector<SRecord>::iterator it = m_vRecord.begin(); \
		it != m_vRecord.end(); ++it)
	{
		/*
		std::cout << "time: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->time << ", ";
		std::cout.unsetf(std::ios::fixed);

		std::cout << "steering_angle: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->steering_angle << ", ";
		std::cout.unsetf(std::ios::fixed);

		std::cout << "encoder_ticks: ";
		std::cout << std::setfill('0') << std::setw(3);
		std::cout << it->encoder_ticks << ", ";

		std::cout << "angular_velocity: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->angular_velocity << std::endl;
		std::cout.unsetf(std::ios::fixed);
		*/

		/// update virtual gyro
		CVirtualGyro::GetInstance()->Update(it->time, it->steering_angle, it->encoder_ticks);

		/// calculate robot pose
		pose = estimate( \
			it->time, \
			it->steering_angle, \
			it->encoder_ticks, \
			CVirtualGyro::GetInstance()->GetAngVel());

		/// write a robot pose to the output files (pose, contour)
		Write(it->time, pose);
	}
	//@}

	/// close result files (pose, contour)
	CloseResultFiles();

	/// draw a result plot
	DrawGnuplot();

	/// wait for user's key press
	//@{
	std::cout << "Press any key in this window to quit." << std::endl;
	getch();
	//@}

#if defined(WIN32)
	if (m_pGnuPlot)
		delete m_pGnuPlot;	///< delete CpGnuplot instance
#else // defined(WIN32)
#endif // defined(WIN32)

	return 0;
}